

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_15824b8::CTransactionSignatureSerializer<CMutableTransaction>::
Serialize<HashWriter>(CTransactionSignatureSerializer<CMutableTransaction> *this,HashWriter *s)

{
  uint uVar1;
  long in_RDI;
  long in_FS_OFFSET;
  CTransactionSignatureSerializer<CMutableTransaction> *unaff_retaddr;
  CTransactionSignatureSerializer<CMutableTransaction> *in_stack_00000008;
  uint nOutput;
  uint nOutputs;
  uint nInput;
  uint nInputs;
  HashWriter *in_stack_ffffffffffffffb8;
  uint64_t in_stack_ffffffffffffffc0;
  HashWriter *nSize;
  HashWriter *os;
  uint local_28;
  uint local_20;
  long lVar2;
  HashWriter *s_00;
  
  s_00 = *(HashWriter **)(in_FS_OFFSET + 0x28);
  lVar2 = in_RDI;
  ::Serialize<HashWriter>(in_stack_ffffffffffffffb8,0);
  if ((*(byte *)(in_RDI + 0x14) & 1) == 0) {
    os = (HashWriter *)
         std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                   ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffffb8);
  }
  else {
    os = (HashWriter *)0x1;
  }
  uVar1 = (uint)os;
  WriteCompactSize<HashWriter>(os,in_stack_ffffffffffffffc0);
  for (local_20 = 0; local_20 < uVar1; local_20 = local_20 + 1) {
    SerializeInput<HashWriter>
              (in_stack_00000008,(HashWriter *)unaff_retaddr,(uint)((ulong)s_00 >> 0x20));
  }
  if ((*(byte *)(in_RDI + 0x16) & 1) == 0) {
    if ((*(byte *)(in_RDI + 0x15) & 1) == 0) {
      in_stack_ffffffffffffffb8 =
           (HashWriter *)
           std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffffb8);
      nSize = in_stack_ffffffffffffffb8;
    }
    else {
      in_stack_ffffffffffffffb8 = (HashWriter *)(ulong)(*(int *)(in_RDI + 0x10) + 1);
      nSize = in_stack_ffffffffffffffb8;
    }
  }
  else {
    nSize = (HashWriter *)0x0;
  }
  WriteCompactSize<HashWriter>(os,(uint64_t)nSize);
  for (local_28 = 0; local_28 < (uint)nSize; local_28 = local_28 + 1) {
    SerializeOutput<HashWriter>(unaff_retaddr,s_00,(uint)((ulong)lVar2 >> 0x20));
  }
  ::Serialize<HashWriter>(in_stack_ffffffffffffffb8,0);
  if (*(HashWriter **)(in_FS_OFFSET + 0x28) != s_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Serialize(S &s) const {
        // Serialize version
        ::Serialize(s, txTo.version);
        // Serialize vin
        unsigned int nInputs = fAnyoneCanPay ? 1 : txTo.vin.size();
        ::WriteCompactSize(s, nInputs);
        for (unsigned int nInput = 0; nInput < nInputs; nInput++)
             SerializeInput(s, nInput);
        // Serialize vout
        unsigned int nOutputs = fHashNone ? 0 : (fHashSingle ? nIn+1 : txTo.vout.size());
        ::WriteCompactSize(s, nOutputs);
        for (unsigned int nOutput = 0; nOutput < nOutputs; nOutput++)
             SerializeOutput(s, nOutput);
        // Serialize nLockTime
        ::Serialize(s, txTo.nLockTime);
    }